

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::listTags
          (XmlReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags)

{
  undefined8 uVar1;
  bool bVar2;
  XmlWriter *pXVar3;
  allocator<char> local_189;
  string local_188;
  StringRef *local_168;
  StringRef *alias;
  iterator __end2;
  iterator __begin2;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range2;
  string local_140 [32];
  undefined1 local_120 [8];
  ScopedElement aliasTag;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_f0;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  ScopedElement innerTag;
  TagInfo *tag;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *__range1;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ScopedElement outerTag;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags_local;
  XmlReporter *this_local;
  
  outerTag._8_8_ = tags;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"TagsFromMatchingTests",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  uVar1 = outerTag._8_8_;
  __end1 = std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::begin
                     ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)outerTag._8_8_);
  tag = (TagInfo *)
        std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::end
                  ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)uVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                                *)&tag);
    if (!bVar2) break;
    innerTag._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
         ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"Tag",&local_b1);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml,(XmlFormatting)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Count",&local_d9);
    pXVar3 = XmlWriter::startElement(&this->m_xml,&local_d8,Indent);
    std::__cxx11::to_string((string *)&aliasTag.m_fmt,*(unsigned_long *)(innerTag._8_8_ + 0x30));
    StringRef::StringRef((StringRef *)&local_f0,(string *)&aliasTag.m_fmt);
    pXVar3 = XmlWriter::writeText(pXVar3,(StringRef)local_f0,None);
    XmlWriter::endElement(pXVar3,Newline);
    std::__cxx11::string::~string((string *)&aliasTag.m_fmt);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"Aliases",(allocator<char> *)((long)&__range2 + 7));
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_120,(string *)&this->m_xml,(XmlFormatting)local_140)
    ;
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    uVar1 = innerTag._8_8_;
    __end2 = std::
             set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
             begin((set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                    *)innerTag._8_8_);
    alias = (StringRef *)
            std::
            set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
            end((set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                 *)uVar1);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&alias);
      if (!bVar2) break;
      local_168 = std::_Rb_tree_const_iterator<Catch::StringRef>::operator*(&__end2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Alias",&local_189);
      pXVar3 = XmlWriter::startElement(&this->m_xml,&local_188,Indent);
      pXVar3 = XmlWriter::writeText(pXVar3,*local_168,None);
      XmlWriter::endElement(pXVar3,Newline);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
      std::_Rb_tree_const_iterator<Catch::StringRef>::operator++(&__end2);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_120);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
    __gnu_cxx::
    __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
    ::operator++(&__end1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  return;
}

Assistant:

void XmlReporter::listTags(std::vector<TagInfo> const& tags) {
        auto outerTag = m_xml.scopedElement("TagsFromMatchingTests");
        for (auto const& tag : tags) {
            auto innerTag = m_xml.scopedElement("Tag");
            m_xml.startElement("Count", XmlFormatting::Indent)
                 .writeText(std::to_string(tag.count), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            auto aliasTag = m_xml.scopedElement("Aliases");
            for (auto const& alias : tag.spellings) {
                m_xml.startElement("Alias", XmlFormatting::Indent)
                     .writeText(alias, XmlFormatting::None)
                     .endElement(XmlFormatting::Newline);
            }
        }
    }